

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

void __thiscall
soul::ResolutionPass::rebuildVariableUseCounts(soul::AST::ModuleBase&)::UseCounter::visit(soul::AST
::Assignment__(void *this,Assignment *a)

{
  undefined2 uVar1;
  
  uVar1 = *(undefined2 *)((long)this + 8);
  *(undefined2 *)((long)this + 8) = 0x100;
  (**(code **)(*this + 0x18))(this,(a->target).object);
  *(undefined2 *)((long)this + 8) = uVar1;
  (**(code **)(*this + 0x18))(this,(a->newValue).object);
  return;
}

Assistant:

void visit (AST::Assignment& a) override
            {
                auto oldWriting = isWriting;
                auto oldReading = isReading;
                isReading = false;
                isWriting = true;
                visitObject (a.target);
                isWriting = oldWriting;
                isReading = oldReading;
                visitObject (a.newValue);
            }